

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

int __thiscall phosg::unlink(phosg *this,char *__name)

{
  bool bVar1;
  uint uVar2;
  uint *puVar3;
  runtime_error *prVar4;
  int error;
  int error_00;
  __node_base *p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  if ((int)__name != 0) {
    bVar1 = isdir((string *)this);
    if (bVar1) {
      list_directory((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_68,(string *)this);
      p_Var5 = &local_68._M_before_begin;
      while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
        ::std::operator+(&bStack_c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         "/");
        ::std::operator+(&local_a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &bStack_c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var5 + 1));
        unlink((phosg *)&local_a8,(char *)0x1);
        ::std::__cxx11::string::~string((string *)&local_a8);
        ::std::__cxx11::string::~string((string *)&bStack_c8);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_68);
      uVar2 = rmdir(*(char **)this);
      puVar3 = (uint *)(ulong)uVar2;
      if (uVar2 != 0) {
        puVar3 = (uint *)__errno_location();
        if (*puVar3 != 2) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::operator+(&bStack_c8,"can\'t delete directory ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                          );
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_a8,&bStack_c8,": ");
          string_for_error_abi_cxx11_(&local_88,(phosg *)(ulong)*puVar3,error_00);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_68,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_88);
          ::std::runtime_error::runtime_error(prVar4,(string *)&local_68);
          __cxa_throw(prVar4,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      goto LAB_0010f992;
    }
  }
  uVar2 = ::unlink(*(char **)this);
  puVar3 = (uint *)(ulong)uVar2;
  if (uVar2 != 0) {
    puVar3 = (uint *)__errno_location();
    if (*puVar3 != 2) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::operator+(&bStack_c8,"can\'t delete file ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_a8,&bStack_c8,": ");
      string_for_error_abi_cxx11_(&local_88,(phosg *)(ulong)*puVar3,error);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_88);
      ::std::runtime_error::runtime_error(prVar4,(string *)&local_68);
      __cxa_throw(prVar4,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
LAB_0010f992:
  return (int)puVar3;
}

Assistant:

void unlink(const string& filename, bool recursive) {
  if (recursive) {
    if (isdir(filename)) {
      for (const string& item : list_directory(filename)) {
        unlink(filename + "/" + item, true);
      }
      if ((::rmdir(filename.c_str()) != 0) && (errno != ENOENT)) {
        throw runtime_error("can\'t delete directory " + filename + ": " + string_for_error(errno));
      }
    } else {
      unlink(filename, false);
    }

  } else {
    if ((::unlink(filename.c_str()) != 0) && (errno != ENOENT)) {
      throw runtime_error("can\'t delete file " + filename + ": " + string_for_error(errno));
    }
  }
}